

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::generateRSA
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Token *pTVar3;
  long *plVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  Session *this_00;
  CryptoFactory *pCVar8;
  undefined4 extraout_var;
  ulong uVar9;
  long *plVar10;
  char *pcVar11;
  ByteString *pBVar12;
  CK_ULONG CVar13;
  CK_ULONG CVar14;
  CK_ATTRIBUTE_PTR p_Var15;
  unsigned_long *puVar16;
  size_t inBitLen;
  CK_RV CVar17;
  bool bVar18;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  ByteString prime1;
  ByteString privateExponent;
  ByteString publicExponent_1;
  ByteString modulus_1;
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  ByteString exponent;
  RSAParameters p;
  ByteString modulus;
  ByteString publicExponent;
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  CK_ATTRIBUTE publicKeyAttribs [32];
  long *local_df0;
  long *local_de8;
  Token *local_de0;
  CK_SESSION_HANDLE local_dd8;
  long *local_dd0;
  long *local_dc8;
  CK_ULONG local_dc0;
  CK_ULONG local_db8;
  CK_ATTRIBUTE_PTR local_db0;
  ByteString local_da8;
  ByteString local_d80;
  ByteString local_d58;
  ByteString local_d30;
  ByteString local_d08;
  ByteString local_ce0;
  ByteString local_cb8;
  ByteString local_c90;
  undefined1 local_c68 [8];
  undefined1 local_c60 [8];
  ByteString local_c58;
  RSAParameters local_c30;
  undefined1 local_bf8 [160];
  undefined1 local_b58 [160];
  OSAttribute local_ab8;
  OSAttribute local_a18;
  OSAttribute local_978;
  OSAttribute local_8d8;
  OSAttribute local_838;
  OSAttribute local_798;
  OSAttribute local_6f8;
  OSAttribute local_658;
  OSAttribute local_5b8;
  OSAttribute local_518;
  OSAttribute local_478;
  OSAttribute local_3d8;
  ByteString local_338;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  OSAttribute *local_2e8;
  undefined8 local_2e0;
  
  *phPublicKey = 0;
  *phPrivateKey = 0;
  local_db0 = pPrivateKeyTemplate;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    CVar17 = 0xb3;
  }
  else {
    local_de0 = Session::getToken(this_00);
    if (local_de0 == (Token *)0x0) {
      CVar17 = 5;
    }
    else {
      local_dd8 = hSession;
      local_dc0 = ulPrivateKeyAttributeCount;
      ByteString::ByteString(&local_c58,"010001");
      local_db8 = ulPublicKeyAttributeCount;
      if (ulPublicKeyAttributeCount == 0) {
        inBitLen = 0;
      }
      else {
        puVar16 = &pPublicKeyTemplate->ulValueLen;
        inBitLen = 0;
        do {
          if (((_CK_ATTRIBUTE *)(puVar16 + -2))->type == 0x122) {
            ByteString::ByteString(&local_338,(uchar *)puVar16[-1],*puVar16);
            ByteString::operator=(&local_c58,&local_338);
            local_338._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_338.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          }
          else if (((_CK_ATTRIBUTE *)(puVar16 + -2))->type == 0x121) {
            if (*puVar16 != 8) {
              CVar17 = 0x13;
              softHSMLog(6,"generateRSA",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x20de,"CKA_MODULUS_BITS does not have the size of CK_ULONG");
              goto LAB_0013c7e1;
            }
            inBitLen = *(size_t *)puVar16[-1];
          }
          puVar16 = puVar16 + 3;
          ulPublicKeyAttributeCount = ulPublicKeyAttributeCount - 1;
        } while (ulPublicKeyAttributeCount != 0);
      }
      if (inBitLen == 0) {
        CVar17 = 0xd0;
        softHSMLog(6,"generateRSA",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x20ed,"Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
      }
      else {
        local_c30.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
             (Serialisable)&PTR_serialise_0019db30;
        ByteString::ByteString(&local_c30.e);
        local_c30.bitLen = 0;
        RSAParameters::setE(&local_c30,&local_c58);
        RSAParameters::setBitLength(&local_c30,inBitLen);
        local_df0 = (long *)0x0;
        pCVar8 = CryptoFactory::i();
        iVar7 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,1);
        plVar10 = (long *)CONCAT44(extraout_var,iVar7);
        CVar17 = 5;
        if (plVar10 != (long *)0x0) {
          cVar5 = (**(code **)(*plVar10 + 0x60))(plVar10,&local_df0,&local_c30,0);
          if (cVar5 == '\0') {
            softHSMLog(3,"generateRSA",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x20fd,"Could not generate key pair");
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,plVar10);
          }
          else {
            local_dc8 = (long *)(**(code **)(*local_df0 + 0x18))();
            local_de8 = plVar10;
            local_dd0 = (long *)(**(code **)(*local_df0 + 0x28))();
            local_978._vptr_OSAttribute = (_func_int **)0x2;
            local_a18._vptr_OSAttribute = (_func_int **)0x0;
            memset(&local_338,0,0x300);
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = &isPublicKeyOnToken;
            local_310 = 1;
            local_308 = 2;
            local_300 = &isPublicKeyPrivate;
            local_2f8 = 1;
            local_2f0 = 0x100;
            CVar17 = 0xd1;
            if (local_db8 < 0x1d) {
              CVar17 = 0;
            }
            local_2e0 = 8;
            CVar13 = 4;
            uVar9 = 1;
            CVar14 = CVar13;
            if (local_db8 - 1 < 0x1c) {
              do {
                uVar1 = pPublicKeyTemplate->type;
                CVar13 = CVar14;
                if (((2 < uVar1) && (uVar1 != 0x100)) && (uVar1 != 0x122)) {
                  CVar13 = CVar14 + 1;
                  (&local_338.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data)[CVar14]._M_start =
                       (pointer)pPublicKeyTemplate->ulValueLen;
                  pp_Var2 = (_func_int **)pPublicKeyTemplate->pValue;
                  (&local_338._vptr_ByteString)[CVar14 * 3] = (_func_int **)pPublicKeyTemplate->type
                  ;
                  (&local_338.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Tp_alloc_type)[CVar14 * 3]._vptr_SecureAllocator = pp_Var2;
                }
                if (0x1c < local_db8) break;
                pPublicKeyTemplate = pPublicKeyTemplate + 1;
                bVar18 = uVar9 < local_db8;
                uVar9 = uVar9 + 1;
                CVar14 = CVar13;
              } while (bVar18);
            }
            local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
            _M_impl.super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&local_978;
            local_2e8 = &local_a18;
            if (local_db8 < 0x1d) {
              CVar17 = CreateObject(this,local_dd8,(CK_ATTRIBUTE_PTR)&local_338,CVar13,phPublicKey,4
                                   );
            }
            if (CVar17 == 0) {
              plVar10 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
              CVar17 = 6;
              if (((plVar10 != (long *)0x0) &&
                  (cVar5 = (**(code **)(*plVar10 + 0x50))(plVar10), cVar5 != '\0')) &&
                 (cVar5 = (**(code **)(*plVar10 + 0x58))(plVar10), cVar5 != '\0')) {
                OSAttribute::OSAttribute(&local_ab8,true);
                cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,&local_ab8);
                pTVar3 = local_de0;
                OSAttribute::~OSAttribute(&local_ab8);
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_ab8,0);
                  cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,&local_ab8);
                  OSAttribute::~OSAttribute(&local_ab8);
                }
                ByteString::ByteString((ByteString *)local_bf8);
                plVar4 = local_dc8;
                ByteString::ByteString((ByteString *)local_b58);
                if (isPublicKeyPrivate == '\0') {
                  pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0x40))(plVar4);
                  ByteString::operator=((ByteString *)local_bf8,pBVar12);
                  pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0x48))(plVar4);
                  ByteString::operator=((ByteString *)local_b58,pBVar12);
                }
                else {
                  pcVar11 = (char *)(**(code **)(*plVar4 + 0x40))(plVar4);
                  Token::encrypt(pTVar3,pcVar11,(int)local_bf8);
                  pcVar11 = (char *)(**(code **)(*plVar4 + 0x48))(plVar4);
                  Token::encrypt(pTVar3,pcVar11,(int)local_b58);
                }
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_3d8,(ByteString *)local_bf8);
                  cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x120,&local_3d8);
                  OSAttribute::~OSAttribute(&local_3d8);
                }
                if (cVar5 == '\0') {
                  cVar5 = '\0';
                }
                else {
                  OSAttribute::OSAttribute(&local_478,(ByteString *)local_b58);
                  cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x122,&local_478);
                  OSAttribute::~OSAttribute(&local_478);
                }
                if (cVar5 == '\0') {
                  (**(code **)(*plVar10 + 0x68))(plVar10);
                  cVar5 = '\0';
                }
                else {
                  cVar5 = (**(code **)(*plVar10 + 0x60))(plVar10);
                }
                CVar17 = 6;
                if (cVar5 != '\0') {
                  CVar17 = 0;
                }
                local_b58._0_8_ = &PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                           (local_b58 + 8));
                local_bf8._0_8_ = &PTR__ByteString_0019f880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                           (local_bf8 + 8));
              }
            }
            if (CVar17 == 0) {
              local_c60 = (undefined1  [8])0x3;
              local_c68 = (undefined1  [8])0x0;
              memset(&local_338,0,0x300);
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x8;
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x1;
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = &isPrivateKeyOnToken;
              local_310 = 1;
              local_308 = 2;
              local_300 = &isPrivateKeyPrivate;
              local_2f8 = 1;
              local_2f0 = 0x100;
              CVar17 = 0xd1;
              if (local_dc0 < 0x1d) {
                CVar17 = 0;
              }
              local_2e0 = 8;
              CVar13 = 4;
              uVar9 = 1;
              CVar14 = CVar13;
              p_Var15 = local_db0;
              if (local_dc0 - 1 < 0x1c) {
                do {
                  CVar13 = CVar14;
                  if ((2 < p_Var15->type) && (p_Var15->type != 0x100)) {
                    CVar13 = CVar14 + 1;
                    (&local_338.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data)[CVar14]._M_start = (pointer)p_Var15->ulValueLen;
                    pp_Var2 = (_func_int **)p_Var15->pValue;
                    (&local_338._vptr_ByteString)[CVar14 * 3] = (_func_int **)p_Var15->type;
                    (&local_338.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                      super__Tp_alloc_type)[CVar14 * 3]._vptr_SecureAllocator = pp_Var2;
                  }
                  if (0x1c < local_dc0) break;
                  p_Var15 = p_Var15 + 1;
                  bVar18 = uVar9 < local_dc0;
                  uVar9 = uVar9 + 1;
                  CVar14 = CVar13;
                } while (bVar18);
              }
              local_338.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)local_c60;
              local_2e8 = (OSAttribute *)local_c68;
              if (local_dc0 < 0x1d) {
                CVar17 = CreateObject(this,local_dd8,(CK_ATTRIBUTE_PTR)&local_338,CVar13,
                                      phPrivateKey,4);
              }
              if (CVar17 == 0) {
                plVar10 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
                CVar17 = 6;
                if (((plVar10 != (long *)0x0) &&
                    (cVar5 = (**(code **)(*plVar10 + 0x50))(plVar10), cVar5 != '\0')) &&
                   (cVar5 = (**(code **)(*plVar10 + 0x58))(plVar10,1), cVar5 != '\0')) {
                  OSAttribute::OSAttribute((OSAttribute *)local_bf8,true);
                  cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x163,local_bf8);
                  pTVar3 = local_de0;
                  OSAttribute::~OSAttribute((OSAttribute *)local_bf8);
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute((OSAttribute *)local_bf8,0);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x166,local_bf8);
                    OSAttribute::~OSAttribute((OSAttribute *)local_bf8);
                  }
                  bVar18 = (bool)(**(code **)(*plVar10 + 0x20))(plVar10,0x103,0);
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute((OSAttribute *)local_b58,bVar18);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x165,local_b58);
                    OSAttribute::~OSAttribute((OSAttribute *)local_b58);
                  }
                  bVar6 = (**(code **)(*plVar10 + 0x20))(plVar10,0x162,0);
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_978,(bool)(bVar6 ^ 1));
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x164,&local_978);
                    OSAttribute::~OSAttribute(&local_978);
                  }
                  ByteString::ByteString(&local_c90);
                  plVar4 = local_dd0;
                  ByteString::ByteString(&local_cb8);
                  ByteString::ByteString(&local_ce0);
                  ByteString::ByteString(&local_d08);
                  ByteString::ByteString(&local_d30);
                  ByteString::ByteString(&local_d58);
                  ByteString::ByteString(&local_d80);
                  ByteString::ByteString(&local_da8);
                  if (isPrivateKeyPrivate == '\0') {
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0xb0))(plVar4);
                    ByteString::operator=(&local_c90,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0xb8))(plVar4);
                    ByteString::operator=(&local_cb8,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0xa8))(plVar4);
                    ByteString::operator=(&local_ce0,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0x80))(plVar4);
                    ByteString::operator=(&local_d08,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0x88))(plVar4);
                    ByteString::operator=(&local_d30,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0x98))(plVar4);
                    ByteString::operator=(&local_d58,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0xa0))(plVar4);
                    ByteString::operator=(&local_d80,pBVar12);
                    pBVar12 = (ByteString *)(**(code **)(*plVar4 + 0x90))(plVar4);
                    ByteString::operator=(&local_da8,pBVar12);
                  }
                  else {
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0xb0))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_c90);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0xb8))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_cb8);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0xa8))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_ce0);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0x80))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_d08);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0x88))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_d30);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0x98))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_d58);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0xa0))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_d80);
                    pcVar11 = (char *)(**(code **)(*plVar4 + 0x90))(plVar4);
                    Token::encrypt(pTVar3,pcVar11,(int)&local_da8);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_a18,&local_c90);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x120,&local_a18);
                    OSAttribute::~OSAttribute(&local_a18);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_518,&local_cb8);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x122,&local_518);
                    OSAttribute::~OSAttribute(&local_518);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_5b8,&local_ce0);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x123,&local_5b8);
                    OSAttribute::~OSAttribute(&local_5b8);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_658,&local_d08);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x124,&local_658);
                    OSAttribute::~OSAttribute(&local_658);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_6f8,&local_d30);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x125,&local_6f8);
                    OSAttribute::~OSAttribute(&local_6f8);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_798,&local_d58);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x126,&local_798);
                    OSAttribute::~OSAttribute(&local_798);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_838,&local_d80);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x127,&local_838);
                    OSAttribute::~OSAttribute(&local_838);
                  }
                  if (cVar5 == '\0') {
                    cVar5 = '\0';
                  }
                  else {
                    OSAttribute::OSAttribute(&local_8d8,&local_da8);
                    cVar5 = (**(code **)(*plVar10 + 0x40))(plVar10,0x128,&local_8d8);
                    OSAttribute::~OSAttribute(&local_8d8);
                  }
                  if (cVar5 == '\0') {
                    (**(code **)(*plVar10 + 0x68))(plVar10);
                    cVar5 = '\0';
                  }
                  else {
                    cVar5 = (**(code **)(*plVar10 + 0x60))(plVar10);
                  }
                  CVar17 = 6;
                  if (cVar5 != '\0') {
                    CVar17 = 0;
                  }
                  local_da8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_da8.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_d80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_d80.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_d58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_d58.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_d30._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_d30.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_d08._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_d08.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_ce0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_ce0.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_cb8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_cb8.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  local_c90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_c90.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                }
              }
            }
            (**(code **)(*local_de8 + 0xc0))(local_de8,local_df0);
            pCVar8 = CryptoFactory::i();
            (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_de8);
            if (CVar17 != 0) {
              if (*phPrivateKey != 0) {
                plVar10 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
                HandleManager::destroyObject(this->handleManager,*phPrivateKey);
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x70))(plVar10);
                }
                *phPrivateKey = 0;
              }
              if (*phPublicKey != 0) {
                plVar10 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
                HandleManager::destroyObject(this->handleManager,*phPublicKey);
                if (plVar10 != (long *)0x0) {
                  (**(code **)(*plVar10 + 0x70))(plVar10);
                }
                *phPublicKey = 0;
              }
            }
          }
        }
        local_c30.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
             (Serialisable)&PTR_serialise_0019db30;
        local_c30.e._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_c30.e.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
LAB_0013c7e1:
      local_c58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_c58.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
  }
  return CVar17;
}

Assistant:

CK_RV SoftHSM::generateRSA
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate
)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information: bitlen and public exponent
	size_t bitLen = 0;
	ByteString exponent("010001");
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_MODULUS_BITS:
				if (pPublicKeyTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_MODULUS_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pPublicKeyTemplate[i].pValue;
				break;
			case CKA_PUBLIC_EXPONENT:
				exponent = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// CKA_MODULUS_BITS must be specified to be able to generate a key pair.
	if (bitLen == 0) {
		INFO_MSG("Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	RSAParameters p;
	p.setE(exponent);
	p.setBitLength(bitLen);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* rsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
	if (rsa == NULL)
		return CKR_GENERAL_ERROR;
	if (!rsa->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);
		return CKR_GENERAL_ERROR;
	}

	RSAPublicKey* pub = (RSAPublicKey*) kp->getPublicKey();
	RSAPrivateKey* priv = (RSAPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_RSA;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
				case CKA_PUBLIC_EXPONENT:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// RSA Public Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getN(), modulus);
					token->encrypt(pub->getE(), publicExponent);
				}
				else
				{
					modulus = pub->getN();
					publicExponent = pub->getE();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_RSA;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// RSA Private Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				ByteString privateExponent;
				ByteString prime1;
				ByteString prime2;
				ByteString exponent1;
				ByteString exponent2;
				ByteString coefficient;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getN(), modulus);
					token->encrypt(priv->getE(), publicExponent);
					token->encrypt(priv->getD(), privateExponent);
					token->encrypt(priv->getP(), prime1);
					token->encrypt(priv->getQ(), prime2);
					token->encrypt(priv->getDP1(), exponent1);
					token->encrypt(priv->getDQ1(), exponent2);
					token->encrypt(priv->getPQ(), coefficient);
				}
				else
				{
					modulus = priv->getN();
					publicExponent = priv->getE();
					privateExponent = priv->getD();
					prime1 = priv->getP();
					prime2 = priv->getQ();
					exponent1 =  priv->getDP1();
					exponent2 = priv->getDQ1();
					coefficient = priv->getPQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIVATE_EXPONENT, privateExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_1, prime1);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_2, prime2);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_1,exponent1);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_2, exponent2);
				bOK = bOK && osobject->setAttribute(CKA_COEFFICIENT, coefficient);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	rsa->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}